

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O3

string * Potassco::string_cast<Clasp::ContextParams::ShareMode>
                   (string *__return_storage_ptr__,ShareMode *num)

{
  long lVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = 8;
  do {
    if (*(ShareMode *)(Clasp::enumMap(Clasp::ContextParams::ShareMode_const*)::map + lVar1) == *num)
    break;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x58);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string string_cast(const U& num) {
	std::string out;
	xconvert(out, num);
	return out;
}